

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_ErrorMgr.cpp
# Opt level: O0

void __thiscall axl::err::ErrorMgr::ErrorMgr(ErrorMgr *this)

{
  _func_int **pp_Var1;
  ErrorRouter *in_RDI;
  DuckTypeHashTable<axl::sl::Guid,_axl::err::ErrorProvider_*,_const_axl::sl::Guid_&,_axl::err::ErrorProvider_*>
  *in_stack_ffffffffffffffb0;
  ErrorProvider *provider;
  Guid *in_stack_ffffffffffffffe8;
  ErrorMgr *in_stack_fffffffffffffff0;
  
  ErrorRouter::ErrorRouter(in_RDI);
  in_RDI->_vptr_ErrorRouter = (_func_int **)&PTR_routeError_0017a788;
  sys::Lock::Lock((Lock *)0x132f75);
  provider = (ErrorProvider *)(in_RDI + 7);
  sl::
  DuckTypeHashTable<axl::sl::Guid,_axl::err::ErrorProvider_*,_const_axl::sl::Guid_&,_axl::err::ErrorProvider_*>
  ::DuckTypeHashTable(in_stack_ffffffffffffffb0);
  sys::getTlsMgr();
  pp_Var1 = (_func_int **)sys::TlsMgr::createSlot((TlsMgr *)0x132fa0);
  in_RDI[6]._vptr_ErrorRouter = pp_Var1;
  in_RDI[0xf]._vptr_ErrorRouter = (_func_int **)0x0;
  sl::getSimpleSingleton<axl::err::StdErrorProvider>((int32_t *)in_stack_ffffffffffffffb0);
  registerProvider(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,provider);
  sl::getSimpleSingleton<axl::err::ErrnoProvider>((int32_t *)in_stack_ffffffffffffffb0);
  registerProvider(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,provider);
  return;
}

Assistant:

ErrorMgr::ErrorMgr() {
	m_tlsSlot = sys::getTlsMgr()->createSlot();
	m_router = NULL;

	registerProvider(g_stdErrorGuid, sl::getSimpleSingleton<StdErrorProvider> ());
	registerProvider(g_errnoGuid, sl::getSimpleSingleton<ErrnoProvider> ());

#if (_AXL_OS_WIN)
	registerProvider(sys::win::g_winErrorGuid, sl::getSimpleSingleton<sys::win::WinErrorProvider> ());
	registerProvider(sys::win::g_ntStatusGuid, sl::getSimpleSingleton<sys::win::NtStatusProvider> ());
	registerProvider(sys::win::g_cfgMgrErrorGuid, sl::getSimpleSingleton<sys::win::CfgMgrErrorProvider> ());
#elif (_AXL_OS_DARWIN)
	registerProvider(sys::drw::g_MachErrorGuid, sl::getSimpleSingleton<sys::drw::MachErrorProvider> ());
#endif
}